

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRuntimeOptions.h
# Opt level: O2

void setupCommandLineOptions(App *app,HighsCommandLineOptions *cmd_options)

{
  _Alloc_hider _Var1;
  Option *pOVar2;
  shared_ptr<CLI::FormatterBase> *psVar3;
  allocator local_992;
  allocator local_991;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  allocator local_96a;
  allocator local_969;
  string local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  _Any_data local_928;
  code *local_918;
  code *local_910;
  _Any_data local_908;
  code *local_8f8;
  code *local_8f0;
  _Any_data local_8e8;
  code *local_8d8;
  code *local_8d0;
  _Any_data local_8c8;
  code *local_8b8;
  code *local_8b0;
  _Any_data local_8a8;
  code *local_898;
  code *local_890;
  _Any_data local_888;
  code *local_878;
  code *local_870;
  _Any_data local_868;
  code *local_858;
  code *local_850;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  string local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  string local_620;
  string local_600;
  string local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  string local_520;
  string local_500;
  string local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  string local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  string local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  string local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  Validator local_160;
  Validator local_f8;
  Validator local_90;
  
  std::operator+(&local_948,"--",&kModelFileString_abi_cxx11_);
  std::operator+(&local_990,&local_948,",");
  std::operator+(&local_180,&local_990,&kModelFileString_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_1a0,"File of model to solve.",&local_991);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (app,&local_180,&cmd_options->model_file,&local_1a0);
  local_868._M_unused._M_object = (void *)0x0;
  local_868._8_8_ = 0;
  local_850 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/HighsRuntimeOptions.h:49:15)>
              ::_M_invoke;
  local_858 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/HighsRuntimeOptions.h:49:15)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_1c0,"",&local_992);
  std::__cxx11::string::string((string *)&local_1e0,"",&local_969);
  pOVar2 = CLI::Option::check(pOVar2,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_868,&local_1c0,&local_1e0);
  CLI::Validator::Validator(&local_90,(Validator *)CLI::ExistingFile);
  std::__cxx11::string::string((string *)&local_968,"",&local_96a);
  CLI::Option::check(pOVar2,&local_90,&local_968);
  std::__cxx11::string::~string((string *)&local_968);
  CLI::Validator::~Validator(&local_90);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_868);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_990);
  std::__cxx11::string::~string((string *)&local_948);
  std::operator+(&local_200,"--",&kOptionsFileString_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&local_220,"File containing HiGHS options.",(allocator *)&local_948);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (app,&local_200,&cmd_options->options_file,&local_220);
  local_888._M_unused._M_object = (void *)0x0;
  local_888._8_8_ = 0;
  local_870 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/HighsRuntimeOptions.h:60:15)>
              ::_M_invoke;
  local_878 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/HighsRuntimeOptions.h:60:15)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_240,"",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_260,"",&local_991);
  pOVar2 = CLI::Option::check(pOVar2,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_888,&local_240,&local_260);
  CLI::Validator::Validator(&local_f8,(Validator *)CLI::ExistingFile);
  std::__cxx11::string::string((string *)&local_990,"",&local_992);
  CLI::Option::check(pOVar2,&local_f8,&local_990);
  std::__cxx11::string::~string((string *)&local_990);
  CLI::Validator::~Validator(&local_f8);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_888);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::operator+(&local_280,"--",&kReadSolutionFileString_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&local_2a0,"File of solution to read.",(allocator *)&local_948);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (app,&local_280,&cmd_options->read_solution_file,&local_2a0);
  local_8a8._M_unused._M_object = (void *)0x0;
  local_8a8._8_8_ = 0;
  local_890 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/HighsRuntimeOptions.h:70:15)>
              ::_M_invoke;
  local_898 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/HighsRuntimeOptions.h:70:15)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_2c0,"",(allocator *)&local_968);
  std::__cxx11::string::string((string *)&local_2e0,"",&local_991);
  pOVar2 = CLI::Option::check(pOVar2,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_8a8,&local_2c0,&local_2e0);
  CLI::Validator::Validator(&local_160,(Validator *)CLI::ExistingFile);
  std::__cxx11::string::string((string *)&local_990,"",&local_992);
  CLI::Option::check(pOVar2,&local_160,&local_990);
  std::__cxx11::string::~string((string *)&local_990);
  CLI::Validator::~Validator(&local_160);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::operator+(&local_300,"--",&kPresolveString_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&local_320,"Set presolve option to:\n\"choose\" * default\n\"on\"\n\"off\"",
             (allocator *)&local_990);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (app,&local_300,&cmd_options->cmd_presolve,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_300);
  std::operator+(&local_340,"--",&kSolverString_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&local_360,
             "Set solver option to:\n\"choose\" * default\n\"simplex\"\n\"ipm\"",
             (allocator *)&local_990);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (app,&local_340,&cmd_options->cmd_solver,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  std::operator+(&local_380,"--",&kParallelString_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&local_3a0,"Set parallel option to:\n\"choose\" * default\n\"on\"\n\"off\"",
             (allocator *)&local_990);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (app,&local_380,&cmd_options->cmd_parallel,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  std::operator+(&local_3c0,"--",&kRunCrossoverString_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&local_3e0,
             "Set run_crossover option to:\n\"choose\"\n\"on\" * default\n\"off\"",
             (allocator *)&local_990);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (app,&local_3c0,&cmd_options->cmd_crossover,&local_3e0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::operator+(&local_400,"--",&kTimeLimitString_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&local_420,"Run time limit (seconds - double).",(allocator *)&local_990);
  CLI::App::add_option<double,_double,_(CLI::detail::enabler)0>
            (app,&local_400,&cmd_options->cmd_time_limit,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_400);
  std::operator+(&local_440,"--",&kSolutionFileString_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&local_460,"File for writing out model solution.",(allocator *)&local_990);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (app,&local_440,&cmd_options->cmd_solution_file,&local_460);
  local_8c8._M_unused._M_object = (void *)0x0;
  local_8c8._8_8_ = 0;
  local_8b0 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/HighsRuntimeOptions.h:106:28)>
              ::_M_invoke;
  local_8b8 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/HighsRuntimeOptions.h:106:28)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_480,"",(allocator *)&local_948);
  std::__cxx11::string::string((string *)&local_4a0,"",(allocator *)&local_968);
  CLI::Option::check(pOVar2,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)&local_8c8,&local_480,&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_480);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_440);
  std::operator+(&local_4c0,"--",&kReadBasisFile_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&local_4e0,"File for initial basis to read.",(allocator *)&local_990);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (app,&local_4c0,&cmd_options->cmd_read_basis_file,&local_4e0);
  local_8e8._M_unused._M_object = (void *)0x0;
  local_8e8._8_8_ = 0;
  local_8d0 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/HighsRuntimeOptions.h:106:28)>
              ::_M_invoke;
  local_8d8 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/HighsRuntimeOptions.h:106:28)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_500,"",(allocator *)&local_948);
  std::__cxx11::string::string((string *)&local_520,"",(allocator *)&local_968);
  CLI::Option::check(pOVar2,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)&local_8e8,&local_500,&local_520);
  std::__cxx11::string::~string((string *)&local_520);
  std::__cxx11::string::~string((string *)&local_500);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::operator+(&local_540,"--",&kWriteBasisFile_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&local_560,"File for final basis to write.",(allocator *)&local_990);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (app,&local_540,&cmd_options->cmd_write_basis_file,&local_560);
  local_908._M_unused._M_object = (void *)0x0;
  local_908._8_8_ = 0;
  local_8f0 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/HighsRuntimeOptions.h:106:28)>
              ::_M_invoke;
  local_8f8 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/HighsRuntimeOptions.h:106:28)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_580,"",(allocator *)&local_948);
  std::__cxx11::string::string((string *)&local_5a0,"",(allocator *)&local_968);
  CLI::Option::check(pOVar2,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)&local_908,&local_580,&local_5a0);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_580);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_908);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_540);
  std::operator+(&local_5c0,"--",&kWriteModelFileString_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&local_5e0,"File for writing out model.",(allocator *)&local_990);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (app,&local_5c0,&cmd_options->cmd_write_model_file,&local_5e0);
  local_928._M_unused._M_object = (void *)0x0;
  local_928._8_8_ = 0;
  local_910 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/HighsRuntimeOptions.h:106:28)>
              ::_M_invoke;
  local_918 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/HighsRuntimeOptions.h:106:28)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_600,"",(allocator *)&local_948);
  std::__cxx11::string::string((string *)&local_620,"",(allocator *)&local_968);
  CLI::Option::check(pOVar2,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)&local_928,&local_600,&local_620);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::~string((string *)&local_600);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_928);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::operator+(&local_640,"--",&kRandomSeedString_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&local_660,"Seed to initialize random number \ngeneration.",
             (allocator *)&local_990);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (app,&local_640,&cmd_options->cmd_random_seed,&local_660);
  std::__cxx11::string::~string((string *)&local_660);
  std::__cxx11::string::~string((string *)&local_640);
  std::operator+(&local_680,"--",&kRangingString_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&local_6a0,
             "Compute cost, bound, RHS and basic \nsolution ranging:\n\"on\"\n\"off\" * default",
             (allocator *)&local_990);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (app,&local_680,&cmd_options->cmd_ranging,&local_6a0);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::__cxx11::string::~string((string *)&local_680);
  std::__cxx11::string::string((string *)&local_6c0,"--version,-v",(allocator *)&local_990);
  std::__cxx11::string::string((string *)&local_6e0,"Print version.",(allocator *)&local_948);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (app,&local_6c0,&cmd_options->cmd_version,&local_6e0);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::__cxx11::string::string((string *)&local_700,"-h,--help",(allocator *)&local_948);
  std::__cxx11::string::string((string *)&local_990,"Print help.",(allocator *)&local_968);
  CLI::App::set_help_flag(app,&local_700,&local_990);
  std::__cxx11::string::~string((string *)&local_990);
  std::__cxx11::string::~string((string *)&local_700);
  psVar3 = &app->formatter_;
  CLI::std::__shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2> *)&local_990,
             &psVar3->super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>);
  *(size_t *)(local_990._M_dataplus._M_p + 8) = 0x21;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_990._M_string_length);
  CLI::std::__shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2> *)&local_990,
             &psVar3->super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>);
  _Var1._M_p = local_990._M_dataplus._M_p;
  std::__cxx11::string::string((string *)&local_720,"TEXT:FILE",(allocator *)&local_948);
  std::__cxx11::string::string((string *)&local_740,"file",(allocator *)&local_968);
  CLI::FormatterBase::label((FormatterBase *)_Var1._M_p,&local_720,&local_740);
  std::__cxx11::string::~string((string *)&local_740);
  std::__cxx11::string::~string((string *)&local_720);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_990._M_string_length);
  CLI::std::__shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2> *)&local_990,
             &psVar3->super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>);
  _Var1._M_p = local_990._M_dataplus._M_p;
  std::__cxx11::string::string((string *)&local_760,"TEXT",(allocator *)&local_948);
  std::__cxx11::string::string((string *)&local_780,"text",(allocator *)&local_968);
  CLI::FormatterBase::label((FormatterBase *)_Var1._M_p,&local_760,&local_780);
  std::__cxx11::string::~string((string *)&local_780);
  std::__cxx11::string::~string((string *)&local_760);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_990._M_string_length);
  CLI::std::__shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2> *)&local_990,
             &psVar3->super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>);
  _Var1._M_p = local_990._M_dataplus._M_p;
  std::__cxx11::string::string((string *)&local_7a0,"FLOAT",(allocator *)&local_948);
  std::__cxx11::string::string((string *)&local_7c0,"float",(allocator *)&local_968);
  CLI::FormatterBase::label((FormatterBase *)_Var1._M_p,&local_7a0,&local_7c0);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::__cxx11::string::~string((string *)&local_7a0);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_990._M_string_length);
  CLI::std::__shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2> *)&local_990,
             &psVar3->super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>);
  _Var1._M_p = local_990._M_dataplus._M_p;
  std::__cxx11::string::string((string *)&local_7e0,"INT",(allocator *)&local_948);
  std::__cxx11::string::string((string *)&local_800,"int",(allocator *)&local_968);
  CLI::FormatterBase::label((FormatterBase *)_Var1._M_p,&local_7e0,&local_800);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::~string((string *)&local_7e0);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_990._M_string_length);
  CLI::std::__shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2> *)&local_990,
             &psVar3->super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&local_820,"OPTIONS",(allocator *)&local_948);
  std::__cxx11::string::string((string *)&local_840,"options",(allocator *)&local_968);
  CLI::FormatterBase::label((FormatterBase *)local_990._M_dataplus._M_p,&local_820,&local_840);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::~string((string *)&local_820);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_990._M_string_length);
  return;
}

Assistant:

void setupCommandLineOptions(CLI::App& app,
                             HighsCommandLineOptions& cmd_options) {
  // Command line file specifications.
  app.add_option("--" + kModelFileString + "," + kModelFileString,
                 cmd_options.model_file, "File of model to solve.")
      // Can't use required here because it breaks version printing with -v.
      // ->required()
      ->check([](const std::string& input) -> std::string {
        // std::cout << "Input is: " << input << std::endl;
        if (input.find(' ') != std::string::npos) {
          return "Multiple files not implemented.";
        }
        return {};
      })
      ->check(CLI::ExistingFile);

  app.add_option("--" + kOptionsFileString, cmd_options.options_file,
                 "File containing HiGHS options.")
      ->check([](const std::string& input) -> std::string {
        if (input.find(' ') != std::string::npos) {
          return "Multiple files not implemented.";
        }
        return {};
      })
      ->check(CLI::ExistingFile);

  app.add_option("--" + kReadSolutionFileString, cmd_options.read_solution_file,
                 "File of solution to read.")
      ->check([](const std::string& input) -> std::string {
        if (input.find(' ') != std::string::npos) {
          return "Multiple files not implemented.";
        }
        return {};
      })
      ->check(CLI::ExistingFile);

  // Command line option specifications.
  app.add_option("--" + kPresolveString, cmd_options.cmd_presolve,
                 "Set presolve option to:\n"
                 "\"choose\" * default\n"
                 "\"on\"\n"
                 "\"off\"");

  app.add_option("--" + kSolverString, cmd_options.cmd_solver,
                 "Set solver option to:\n"
                 "\"choose\" * default\n"
                 "\"simplex\"\n"
                 "\"ipm\"");

  app.add_option("--" + kParallelString, cmd_options.cmd_parallel,
                 "Set parallel option to:\n"
                 "\"choose\" * default\n"
                 "\"on\"\n"
                 "\"off\"");

  app.add_option("--" + kRunCrossoverString, cmd_options.cmd_crossover,
                 "Set run_crossover option to:\n"
                 "\"choose\"\n"
                 "\"on\" * default\n"
                 "\"off\"");

  app.add_option("--" + kTimeLimitString, cmd_options.cmd_time_limit,
                 "Run time limit (seconds - double).");

  const auto checkSingle = [](const std::string& input) -> std::string {
    if (input.find(' ') != std::string::npos) {
      return "Multiple files not implemented.";
    }
    return {};
  };

  app.add_option("--" + kSolutionFileString, cmd_options.cmd_solution_file,
                 "File for writing out model solution.")
      ->check(checkSingle);

  app.add_option("--" + kReadBasisFile, cmd_options.cmd_read_basis_file,
                 "File for initial basis to read.")
      ->check(checkSingle);

  app.add_option("--" + kWriteBasisFile, cmd_options.cmd_write_basis_file,
                 "File for final basis to write.")
      ->check(checkSingle);

  app.add_option("--" + kWriteModelFileString, cmd_options.cmd_write_model_file,
                 "File for writing out model.")
      ->check(checkSingle);

  app.add_option("--" + kRandomSeedString, cmd_options.cmd_random_seed,
                 "Seed to initialize random number \ngeneration.");

  app.add_option("--" + kRangingString, cmd_options.cmd_ranging,
                 "Compute cost, bound, RHS and basic \nsolution ranging:\n"
                 "\"on\"\n"
                 "\"off\" * default");

  // Version.
  app.add_flag("--version,-v", cmd_options.cmd_version, "Print version.");
  app.set_help_flag("-h,--help", "Print help.");

  app.get_formatter()->column_width(33);

  app.get_formatter()->label("TEXT:FILE", "file");
  app.get_formatter()->label("TEXT", "text");
  app.get_formatter()->label("FLOAT", "float");
  app.get_formatter()->label("INT", "int");
  app.get_formatter()->label("OPTIONS", "options");
}